

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall PSBTOutput::Unserialize<DataStream>(PSBTOutput *this,DataStream *s)

{
  Span<const_unsigned_char> data;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> vch;
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  Span<const_unsigned_char> script_00;
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  size_type sVar4;
  char *pcVar5;
  uchar *puVar6;
  size_type sVar7;
  size_type sVar8;
  char *pcVar9;
  error_code *this_00;
  byte extraout_DL;
  byte extraout_DL_00;
  byte extraout_DL_01;
  byte extraout_DL_02;
  byte extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>,_bool>
  pVar10;
  size_t origin_len;
  size_t hashes_len;
  size_t after_hashes;
  size_t before_hashes;
  uint64_t value_len;
  uint64_t type;
  bool found_sep;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_bytes;
  PSBTProprietary this_prop;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  uint8_t leaf_ver;
  uint8_t depth;
  SpanReader s_tree;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tree_v;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> leaf_hashes;
  XOnlyPubKey xonly;
  TaprootBuilder builder;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  TaprootBuilder *in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  undefined4 uVar11;
  io_errc in_stack_fffffffffffff854;
  io_errc __e;
  TaprootBuilder *in_stack_fffffffffffff858;
  XOnlyPubKey *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
  *in_stack_fffffffffffff870;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffff878;
  XOnlyPubKey *in_stack_fffffffffffff890;
  DataStream *in_stack_fffffffffffff898;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  *in_stack_fffffffffffff8c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff8d0;
  undefined1 range_check;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  _Rb_tree_iterator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>
  in_stack_fffffffffffff8e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff8e8;
  uchar *in_stack_fffffffffffff908;
  size_t in_stack_fffffffffffff910;
  int local_4e0;
  vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_4a8 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_470;
  Span<unsigned_char> local_400;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_3b0;
  byte local_342;
  byte local_341;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_2d8;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_2a8;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_278;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_248;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
  *local_200;
  pair<std::_Rb_tree_const_iterator<PSBTProprietary>,_bool> *local_1f0;
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_1b0;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_1a0;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_190;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_180;
  pair<std::_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  *local_170;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         *)in_stack_fffffffffffff848);
  bVar1 = false;
  do {
    bVar2 = DataStream::empty((DataStream *)in_stack_fffffffffffff858);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff848);
    DataStream::operator>>
              ((DataStream *)in_stack_fffffffffffff858,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffff858);
    if (bVar2) {
      bVar1 = true;
      local_4e0 = 3;
    }
    else {
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffff858,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff848);
      data.m_data._4_4_ = in_stack_fffffffffffff854;
      data.m_data._0_4_ = in_stack_fffffffffffff850;
      data.m_size = (size_t)in_stack_fffffffffffff858;
      SpanReader::SpanReader((SpanReader *)in_stack_fffffffffffff848,data);
      uVar3 = ReadCompactSize<SpanReader>
                        ((SpanReader *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8)
                         ,SUB81((ulong)in_stack_fffffffffffff8d0 >> 0x38,0));
      if (uVar3 == 0) {
        local_248 = std::
                    set<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ::emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                              ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffff858,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        local_170 = local_248;
        if (((extraout_DL ^ 0xff) & 1) != 0) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Duplicate Key, output redeemScript already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff848);
        if (sVar4 != 1) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Output redeemScript key is more than one byte type");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        DataStream::operator>>
                  ((DataStream *)in_stack_fffffffffffff858,
                   (CScript *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
      }
      else if (uVar3 == 1) {
        local_278 = std::
                    set<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ::emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                              ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffff858,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        local_180 = local_278;
        if (((extraout_DL_00 ^ 0xff) & 1) != 0) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Duplicate Key, output witnessScript already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff848);
        if (sVar4 != 1) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Output witnessScript key is more than one byte type");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        DataStream::operator>>
                  ((DataStream *)in_stack_fffffffffffff858,
                   (CScript *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
      }
      else if (uVar3 == 2) {
        DeserializeHDKeypaths<DataStream>
                  ((DataStream *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                   in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      }
      else if (uVar3 == 5) {
        local_2a8 = std::
                    set<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ::emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                              ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffff858,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        local_190 = local_2a8;
        if (((extraout_DL_01 ^ 0xff) & 1) != 0) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)
                            "Duplicate Key, output Taproot internal key already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff848);
        if (sVar4 != 1) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)
                            "Output Taproot internal key key is more than one byte type");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        UnserializeFromVector<DataStream,XOnlyPubKey&>
                  (in_stack_fffffffffffff898,in_stack_fffffffffffff890);
      }
      else if (uVar3 == 6) {
        local_2d8 = std::
                    set<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ::emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                              ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffff858,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        local_1a0 = local_2d8;
        if (((extraout_DL_02 ^ 0xff) & 1) != 0) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Duplicate Key, output Taproot tree already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff848);
        if (sVar4 != 1) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Output Taproot tree key is more than one byte type");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff848);
        DataStream::operator>>
                  ((DataStream *)in_stack_fffffffffffff858,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffff858,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                   in_stack_fffffffffffff848);
        data_00.m_data._4_4_ = in_stack_fffffffffffff854;
        data_00.m_data._0_4_ = in_stack_fffffffffffff850;
        data_00.m_size = (size_t)in_stack_fffffffffffff858;
        SpanReader::SpanReader((SpanReader *)in_stack_fffffffffffff848,data_00);
        bVar2 = SpanReader::empty((SpanReader *)in_stack_fffffffffffff848);
        if (bVar2) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Output Taproot tree must not be empty");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        TaprootBuilder::TaprootBuilder
                  ((TaprootBuilder *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868));
        while (bVar2 = SpanReader::empty((SpanReader *)in_stack_fffffffffffff848),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff848);
          SpanReader::operator>>
                    ((SpanReader *)in_stack_fffffffffffff858,
                     (uchar *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
          SpanReader::operator>>
                    ((SpanReader *)in_stack_fffffffffffff858,
                     (uchar *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
          SpanReader::operator>>
                    ((SpanReader *)in_stack_fffffffffffff858,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
          if (0x80 < local_341) {
            pcVar9 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar9,(error_code *)
                              "Output Taproot tree has as leaf greater than Taproot maximum depth");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_006b617d;
          }
          if ((local_342 & 1) != 0) {
            pcVar9 = (char *)__cxa_allocate_exception(0x20);
            std::error_code::error_code<std::io_errc,void>
                      ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar9,(error_code *)
                              "Output Taproot tree has a leaf with an invalid leaf version");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_006b617d;
          }
          std::
          vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
          ::
          emplace_back<unsigned_char&,unsigned_char&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    (in_stack_fffffffffffff878,(uchar *)in_stack_fffffffffffff870,
                     (uchar *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff860);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffff858,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                     in_stack_fffffffffffff848);
          script_00.m_size = in_stack_fffffffffffff910;
          script_00.m_data = in_stack_fffffffffffff908;
          TaprootBuilder::Add((TaprootBuilder *)
                              CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                              (int)((ulong)in_stack_fffffffffffff898 >> 0x20),script_00,
                              (int)in_stack_fffffffffffff898,
                              SUB81((ulong)in_stack_fffffffffffff890 >> 0x38,0));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff858);
        }
        bVar2 = TaprootBuilder::IsComplete(in_stack_fffffffffffff858);
        if (!bVar2) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Output Taproot tree is malformed");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        TaprootBuilder::~TaprootBuilder(in_stack_fffffffffffff848);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff858);
      }
      else if (uVar3 == 7) {
        local_3b0 = std::
                    set<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ::emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                              ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)in_stack_fffffffffffff858,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        local_1b0 = local_3b0;
        if (((extraout_DL_03 ^ 0xff) & 1) != 0) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)
                            "Duplicate Key, output Taproot BIP32 keypath already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffff848);
        if (sVar4 != 0x21) {
          pcVar5 = (char *)__cxa_allocate_exception(0x20);
          pcVar9 = pcVar5;
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar5,(error_code *)"Output Taproot BIP32 keypath key is not at 33 bytes");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<unsigned_char> *)in_stack_fffffffffffff858,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                   in_stack_fffffffffffff848);
        local_400 = Span<unsigned_char>::last
                              ((Span<unsigned_char> *)in_stack_fffffffffffff858,
                               CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        Span<const_unsigned_char>::Span<unsigned_char,_0>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffff848,
                   (Span<unsigned_char> *)0x6b5996);
        vch.m_size._0_7_ = in_stack_fffffffffffff868;
        vch.m_data = (uchar *)in_stack_fffffffffffff860;
        vch.m_size._7_1_ = in_stack_fffffffffffff86f;
        uint256::uint256((uint256 *)in_stack_fffffffffffff848,vch);
        std::span<const_unsigned_char,_18446744073709551615UL>::span<uint256>
                  ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff858,
                   (uint256 *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        bytes._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff868;
        bytes._M_ptr = (pointer)in_stack_fffffffffffff860;
        bytes._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff86f;
        XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_fffffffffffff848,bytes);
        std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
                  ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   in_stack_fffffffffffff848);
        puVar6 = (uchar *)ReadCompactSize<DataStream>
                                    ((DataStream *)
                                     CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                                     SUB81((ulong)in_stack_fffffffffffff8d0 >> 0x38,0));
        in_stack_fffffffffffff908 = puVar6;
        sVar7 = DataStream::size((DataStream *)in_stack_fffffffffffff858);
        DataStream::operator>>
                  ((DataStream *)in_stack_fffffffffffff858,
                   (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        sVar8 = DataStream::size((DataStream *)in_stack_fffffffffffff858);
        if (puVar6 < (uchar *)(sVar7 - sVar8)) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Output Taproot BIP32 keypath has an invalid length");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        in_stack_fffffffffffff8e8 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xa8);
        DeserializeKeyOrigin<DataStream>
                  (in_stack_fffffffffffff898,(uint64_t)in_stack_fffffffffffff890);
        std::make_pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>&,KeyOriginInfo>
                  ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                   (KeyOriginInfo *)in_stack_fffffffffffff848);
        pVar10 = std::
                 map<XOnlyPubKey,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                 ::
                 emplace<XOnlyPubKey&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                           ((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                            in_stack_fffffffffffff860,
                            (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                             *)in_stack_fffffffffffff858);
        in_stack_fffffffffffff8e0 = pVar10.first._M_node;
        in_stack_fffffffffffff8df = pVar10.second;
        local_1e0 = in_stack_fffffffffffff8e0._M_node;
        local_1d8 = in_stack_fffffffffffff8df;
        std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
        ~pair((pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
               *)in_stack_fffffffffffff848);
        KeyOriginInfo::~KeyOriginInfo((KeyOriginInfo *)in_stack_fffffffffffff848);
        std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
                  ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   in_stack_fffffffffffff848);
      }
      else if (uVar3 == 0xfc) {
        PSBTProprietary::PSBTProprietary((PSBTProprietary *)in_stack_fffffffffffff848);
        range_check = (undefined1)((ulong)in_stack_fffffffffffff8d0 >> 0x38);
        SpanReader::operator>>
                  ((SpanReader *)in_stack_fffffffffffff858,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        in_stack_fffffffffffff8d0 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ReadCompactSize<SpanReader>
                       ((SpanReader *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                        (bool)range_check);
        local_470 = in_stack_fffffffffffff8d0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (in_stack_fffffffffffff8e8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff8e0._M_node);
        in_stack_fffffffffffff8c8 =
             (map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
              *)std::
                set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::
                count((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                       *)in_stack_fffffffffffff858,
                      (key_type *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        if (in_stack_fffffffffffff8c8 !=
            (map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
             *)0x0) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Duplicate Key, proprietary key already found");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        DataStream::operator>>
                  ((DataStream *)in_stack_fffffffffffff858,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        local_1f0 = std::
                    set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                    ::insert((set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                              *)in_stack_fffffffffffff858,
                             (value_type *)
                             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        in_stack_fffffffffffff8a7 = extraout_DL_04;
        PSBTProprietary::~PSBTProprietary((PSBTProprietary *)in_stack_fffffffffffff848);
      }
      else {
        in_stack_fffffffffffff898 =
             (DataStream *)
             std::
             map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::count((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)in_stack_fffffffffffff858,
                     (key_type *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        if (in_stack_fffffffffffff898 != (DataStream *)0x0) {
          pcVar9 = (char *)__cxa_allocate_exception(0x20);
          std::error_code::error_code<std::io_errc,void>
                    ((error_code *)in_stack_fffffffffffff858,in_stack_fffffffffffff854);
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar9,(error_code *)"Duplicate Key, key for unknown value already provided");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar9,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_006b617d;
        }
        in_stack_fffffffffffff878 = local_4a8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff848);
        DataStream::operator>>
                  ((DataStream *)in_stack_fffffffffffff858,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
        in_stack_fffffffffffff870 =
             std::
             map<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
             ::
             emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffff860,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffff858);
        in_stack_fffffffffffff86f = extraout_DL_05;
        local_200 = in_stack_fffffffffffff870;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff858);
      }
      local_4e0 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff858);
  } while (local_4e0 == 0);
  if (bVar1) {
    std::
    set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff848);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this_00 = (error_code *)__cxa_allocate_exception(0x20);
    uVar11 = SUB84(this_00,0);
    __e = (io_errc)((ulong)this_00 >> 0x20);
    std::error_code::error_code<std::io_errc,void>(this_00,__e);
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)this_00,(error_code *)"Separator is missing at the end of an output map");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(CONCAT44(__e,uVar11),&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_006b617d:
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Read loop
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_OUT_REDEEMSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output redeemScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output redeemScript key is more than one byte type");
                    }
                    s >> redeem_script;
                    break;
                }
                case PSBT_OUT_WITNESSSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output witnessScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output witnessScript key is more than one byte type");
                    }
                    s >> witness_script;
                    break;
                }
                case PSBT_OUT_BIP32_DERIVATION:
                {
                    DeserializeHDKeypaths(s, key, hd_keypaths);
                    break;
                }
                case PSBT_OUT_TAP_INTERNAL_KEY:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot internal key already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output Taproot internal key key is more than one byte type");
                    }
                    UnserializeFromVector(s, m_tap_internal_key);
                    break;
                }
                case PSBT_OUT_TAP_TREE:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot tree already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output Taproot tree key is more than one byte type");
                    }
                    std::vector<unsigned char> tree_v;
                    s >> tree_v;
                    SpanReader s_tree{tree_v};
                    if (s_tree.empty()) {
                        throw std::ios_base::failure("Output Taproot tree must not be empty");
                    }
                    TaprootBuilder builder;
                    while (!s_tree.empty()) {
                        uint8_t depth;
                        uint8_t leaf_ver;
                        std::vector<unsigned char> script;
                        s_tree >> depth;
                        s_tree >> leaf_ver;
                        s_tree >> script;
                        if (depth > TAPROOT_CONTROL_MAX_NODE_COUNT) {
                            throw std::ios_base::failure("Output Taproot tree has as leaf greater than Taproot maximum depth");
                        }
                        if ((leaf_ver & ~TAPROOT_LEAF_MASK) != 0) {
                            throw std::ios_base::failure("Output Taproot tree has a leaf with an invalid leaf version");
                        }
                        m_tap_tree.emplace_back(depth, leaf_ver, script);
                        builder.Add((int)depth, script, (int)leaf_ver, /*track=*/true);
                    }
                    if (!builder.IsComplete()) {
                        throw std::ios_base::failure("Output Taproot tree is malformed");
                    }
                    break;
                }
                case PSBT_OUT_TAP_BIP32_DERIVATION:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot BIP32 keypath already provided");
                    } else if (key.size() != 33) {
                        throw std::ios_base::failure("Output Taproot BIP32 keypath key is not at 33 bytes");
                    }
                    XOnlyPubKey xonly(uint256(Span<uint8_t>(key).last(32)));
                    std::set<uint256> leaf_hashes;
                    uint64_t value_len = ReadCompactSize(s);
                    size_t before_hashes = s.size();
                    s >> leaf_hashes;
                    size_t after_hashes = s.size();
                    size_t hashes_len = before_hashes - after_hashes;
                    if (hashes_len > value_len) {
                        throw std::ios_base::failure("Output Taproot BIP32 keypath has an invalid length");
                    }
                    size_t origin_len = value_len - hashes_len;
                    m_tap_bip32_paths.emplace(xonly, std::make_pair(leaf_hashes, DeserializeKeyOrigin(s, origin_len)));
                    break;
                }
                case PSBT_OUT_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default: {
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                    break;
                }
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of an output map");
        }
    }